

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t write_new_bucket(int idx,linear_hash_table_t *linear_hash)

{
  int iVar1;
  FILE *__s;
  array_list_t *array_list;
  long lVar2;
  ion_err_t iVar3;
  int iVar4;
  long bucket_loc;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uStack_60;
  undefined1 auStack_58 [8];
  int local_50 [2];
  linear_hash_bucket_t bucket;
  ulong uVar8;
  
  if ((FILE *)linear_hash->database == (FILE *)0x0) {
    iVar3 = '\t';
  }
  else {
    local_50[1] = 0;
    bucket.idx = -1;
    bucket.record_count = -1;
    uStack_60 = 0x10fa34;
    local_50[0] = idx;
    iVar4 = fseek((FILE *)linear_hash->database,0,2);
    iVar3 = '\r';
    if (iVar4 == 0) {
      uStack_60 = 0x10fa49;
      bucket_loc = ftell((FILE *)linear_hash->database);
      uStack_60 = 0x10fa5f;
      sVar5 = fwrite(local_50,0x10,1,(FILE *)linear_hash->database);
      iVar3 = '\a';
      if (sVar5 == 1) {
        lVar2 = -((long)(linear_hash->super).record.key_size +
                  (long)(linear_hash->super).record.value_size + 0x13U & 0xfffffffffffffff0);
        iVar4 = (linear_hash->super).record.key_size;
        iVar1 = (linear_hash->super).record.value_size;
        bucket.overflow_location = (ion_fpos_t)auStack_58;
        *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x10faa7;
        memset(auStack_58 + lVar2,0,(long)iVar1 + (long)iVar4);
        *(undefined8 *)(auStack_58 + lVar2 + -8) = 0xffffffffffffffff;
        uVar8 = *(ulong *)(auStack_58 + lVar2 + -8);
        *(undefined8 *)(auStack_58 + lVar2 + -8) = 1;
        sVar5 = *(size_t *)(auStack_58 + lVar2 + -8);
        do {
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          if (linear_hash->records_per_bucket <= (int)uVar7) {
            array_list = linear_hash->bucket_map;
            *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x10faf4;
            iVar3 = array_list_insert(idx,bucket_loc,array_list);
            return iVar3;
          }
          iVar4 = (linear_hash->super).record.key_size;
          iVar1 = (linear_hash->super).record.value_size;
          __s = (FILE *)linear_hash->database;
          *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x10fad7;
          sVar6 = fwrite(auStack_58 + lVar2,(long)iVar1 + (long)iVar4 + 4,sVar5,__s);
        } while (sVar6 == 1);
        iVar3 = '\a';
      }
    }
  }
  return iVar3;
}

Assistant:

ion_err_t
write_new_bucket(
	int					idx,
	linear_hash_table_t *linear_hash
) {
	if (linear_hash->database == NULL) {
		return err_file_open_error;
	}

	linear_hash_bucket_t bucket;

	/* initialize bucket fields */
	bucket.idx					= idx;
	bucket.record_count			= 0;
	bucket.overflow_location	= linear_hash_end_of_list;

	/* seek to end of file to append new bucket */
	ion_fpos_t bucket_loc;

	if (0 != fseek(linear_hash->database, 0, SEEK_END)) {
		return err_file_bad_seek;
	}

	bucket_loc = ftell(linear_hash->database);

	/* write bucket data to file */
	if (1 != fwrite(&bucket, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_write_error;
	}

	/* write bucket data to file */
	ion_byte_t record_blank[linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty)];

	memset(record_blank, 0, linear_hash->super.record.key_size + linear_hash->super.record.value_size);

	int i;

	for (i = 0; i < linear_hash->records_per_bucket; i++) {
		if (1 != fwrite(record_blank, linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty), 1, linear_hash->database)) {
			return err_file_write_error;
		}
	}

	/* write bucket_loc in mapping */
	/* store_bucket_loc_in_map(idx, bucket_loc, linear_hash); */
	ion_err_t err = array_list_insert(idx, bucket_loc, linear_hash->bucket_map);

	if (err != err_ok) {
		return err;
	}

	return err_ok;
}